

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_trompeloeil.hpp
# Opt level: O2

void trompeloeil::reporter<trompeloeil::specialized>::sendOk
               (char *trompeloeil_mock_calls_done_correctly)

{
  long in_RDI;
  undefined4 local_9c;
  undefined1 local_98 [8];
  AssertionHandler local_90;
  undefined **local_48;
  undefined1 local_40;
  undefined1 local_3f;
  undefined1 *local_38;
  char *local_30;
  undefined8 local_28;
  undefined4 *local_20;
  
  local_90.m_assertionInfo.macroName.m_start = "REQUIRE";
  local_90.m_assertionInfo.macroName.m_size = 7;
  local_90.m_assertionInfo.lineInfo.file =
       "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]scope_guard/test/3rdparty/Catch2/catch_trompeloeil.hpp"
  ;
  local_90.m_assertionInfo.lineInfo.line = 0x35;
  local_90.m_assertionInfo.capturedExpression.m_start = "trompeloeil_mock_calls_done_correctly != 0"
  ;
  local_90.m_assertionInfo.capturedExpression.m_size = 0x2a;
  local_90.m_assertionInfo.resultDisposition = Normal;
  local_90.m_reaction.shouldDebugBreak = false;
  local_90.m_reaction.shouldThrow = false;
  local_90.m_completed = false;
  local_90.m_resultCapture = Catch::getResultCapture();
  local_20 = &local_9c;
  local_9c = 0;
  local_3f = in_RDI != 0;
  local_40 = 1;
  local_48 = &PTR_streamReconstructedExpression_00182140;
  local_30 = "!=";
  local_28 = 2;
  local_38 = local_98;
  (*(local_90.m_resultCapture)->_vptr_IResultCapture[10])
            (local_90.m_resultCapture,&local_90,&local_48,&local_90.m_reaction);
  Catch::AssertionHandler::complete(&local_90);
  Catch::AssertionHandler::~AssertionHandler(&local_90);
  return;
}

Assistant:

inline void reporter<specialized>::sendOk(
    const char* trompeloeil_mock_calls_done_correctly)
  {      
      REQUIRE(trompeloeil_mock_calls_done_correctly != 0);
  }